

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeSerializer.cpp
# Opt level: O0

byte * __thiscall
Js::ByteCodeBufferReader::ReadCharCount
          (ByteCodeBufferReader *this,byte *buffer,size_t remainingBytes,charcount_t *value)

{
  byte *pbVar1;
  charcount_t *value_local;
  size_t remainingBytes_local;
  byte *buffer_local;
  ByteCodeBufferReader *this_local;
  
  pbVar1 = ReadVariableInt<unsigned_int>(buffer,remainingBytes,value);
  return pbVar1;
}

Assistant:

const byte * ReadCharCount(const byte * buffer, size_t remainingBytes, charcount_t * value)
    {
#if VARIABLE_INT_ENCODING
        return ReadVariableInt<charcount_t>(buffer, remainingBytes, value);
#else
        Assert(remainingBytes >= sizeof(charcount_t));
        *value = *(charcount_t *) buffer;
        return buffer + sizeof(charcount_t);
#endif
    }